

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lcode.c
# Opt level: O0

int validop(int op,TValue *v1,TValue *v2)

{
  int iVar1;
  double local_40;
  int local_34;
  bool local_2d;
  Value local_28;
  lua_Integer i;
  TValue *v2_local;
  TValue *v1_local;
  int op_local;
  
  if ((op == 3) || (op - 5U < 2)) {
    if (v2->tt_ == 0x13) {
      local_40 = (double)(v2->value_).i;
    }
    else {
      local_40 = (v2->value_).n;
    }
    return (uint)(local_40 != 0.0);
  }
  if ((4 < op - 7U) && (op != 0xd)) {
    return 1;
  }
  i = (lua_Integer)v2;
  v2_local = v1;
  v1_local._0_4_ = op;
  if (v1->tt_ == 0x13) {
    local_28 = v1->value_;
  }
  else {
    iVar1 = luaV_tointeger(v1,&local_28.i,0);
    local_2d = false;
    if (iVar1 == 0) goto LAB_001382fb;
  }
  if (*(int *)(i + 8) == 0x13) {
    local_34 = 1;
  }
  else {
    local_34 = luaV_tointeger((TValue *)i,&local_28.i,0);
  }
  local_2d = local_34 != 0;
LAB_001382fb:
  return (uint)local_2d;
}

Assistant:

static int validop (int op, TValue *v1, TValue *v2) {
  switch (op) {
    case LUA_OPBAND: case LUA_OPBOR: case LUA_OPBXOR:
    case LUA_OPSHL: case LUA_OPSHR: case LUA_OPBNOT: {  /* conversion errors */
      lua_Integer i;
      return (tointeger(v1, &i) && tointeger(v2, &i));
    }
    case LUA_OPDIV: case LUA_OPIDIV: case LUA_OPMOD:  /* division by 0 */
      return (nvalue(v2) != 0);
    default: return 1;  /* everything else is valid */
  }
}